

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_hello_decode_key_share
              (ptls_key_exchange_algorithm_t **selected_group,ptls_iovec_t *selected_key,
              ptls_key_exchange_algorithm_t **candidates,uint8_t *src,uint8_t *end)

{
  ushort *puVar1;
  int iVar2;
  ushort *puVar3;
  ulong uVar4;
  ushort *puVar5;
  ptls_key_exchange_algorithm_t *ppVar6;
  ptls_key_exchange_algorithm_t **pppVar7;
  
  iVar2 = 0x32;
  if (1 < (ulong)((long)end - (long)src)) {
    uVar4 = (ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
    puVar5 = (ushort *)(src + 2);
    if (uVar4 <= (ulong)((long)end - (long)puVar5)) {
      puVar3 = puVar5;
      if (uVar4 != 0) {
        puVar3 = (ushort *)(src + uVar4 + 2);
        do {
          if ((long)puVar3 - (long)puVar5 < 2) {
            return 0x32;
          }
          if (((long)puVar3 - (long)puVar5) - 2U < 2) {
            return 0x32;
          }
          puVar1 = puVar5 + 2;
          uVar4 = (ulong)(ushort)(puVar5[1] << 8 | puVar5[1] >> 8);
          if ((ulong)((long)puVar3 - (long)puVar1) < uVar4) {
            return 0x32;
          }
          if ((*selected_group == (ptls_key_exchange_algorithm_t *)0x0) &&
             (ppVar6 = *candidates, ppVar6 != (ptls_key_exchange_algorithm_t *)0x0)) {
            pppVar7 = candidates + 1;
            do {
              if (ppVar6->id == (uint16_t)(*puVar5 << 8 | *puVar5 >> 8)) {
                *selected_group = ppVar6;
                selected_key->base = (uint8_t *)puVar1;
                selected_key->len = uVar4;
                break;
              }
              ppVar6 = *pppVar7;
              pppVar7 = pppVar7 + 1;
            } while (ppVar6 != (ptls_key_exchange_algorithm_t *)0x0);
          }
          puVar5 = (ushort *)((long)puVar1 + uVar4);
        } while (puVar5 != puVar3);
      }
      iVar2 = 0x32;
      if (puVar3 == (ushort *)end) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int client_hello_decode_key_share(ptls_key_exchange_algorithm_t **selected_group, ptls_iovec_t *selected_key,
                                         ptls_key_exchange_algorithm_t **candidates, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        while (src != end) {
            uint16_t group;
            ptls_iovec_t key;
            if ((ret = decode_key_share_entry(&group, &key, &src, end)) != 0)
                goto Exit;
            if (*selected_group == NULL) {
                ptls_key_exchange_algorithm_t **c = candidates;
                for (; *c != NULL; ++c) {
                    if ((*c)->id == group) {
                        *selected_group = *c;
                        *selected_key = key;
                        break;
                    }
                }
            }
        }
    });

Exit:
    return ret;
}